

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# log-demo.cpp
# Opt level: O0

int main(void)

{
  initializer_list<std::shared_ptr<tlog::IOutput>_> __l;
  Stream *pSVar1;
  shared_ptr<tlog::ConsoleOutput> *__r;
  shared_ptr<tlog::IOutput> *local_390;
  Stream local_2d8;
  allocator local_2b9;
  string local_2b8 [36];
  int local_294;
  duration<long,_std::ratio<1L,_1000L>_> local_290;
  int local_284;
  undefined1 auStack_280 [4];
  int i_1;
  time_point local_278;
  duration local_270;
  uint64_t local_268;
  allocator local_259;
  string local_258 [38];
  allocator<std::shared_ptr<tlog::IOutput>_> local_232;
  less<std::shared_ptr<tlog::IOutput>_> local_231;
  shared_ptr<tlog::IOutput> *local_230;
  shared_ptr<tlog::IOutput> local_228;
  shared_ptr<tlog::IOutput> local_218;
  set<std::shared_ptr<tlog::IOutput>,_std::less<std::shared_ptr<tlog::IOutput>_>,_std::allocator<std::shared_ptr<tlog::IOutput>_>_>
  local_208;
  allocator local_1d1;
  string local_1d0 [32];
  undefined1 local_1b0 [8];
  Logger scopedLogger;
  tlog local_128 [32];
  Stream local_108;
  int local_ec;
  duration<long,_std::ratio<1L,_1000L>_> local_e8;
  int local_dc;
  undefined1 auStack_d8 [4];
  int i;
  Progress progress;
  Stream local_a0;
  Stream local_88;
  Stream local_70;
  int local_54;
  Stream local_50;
  Stream local_28;
  int local_c;
  
  local_c = 0;
  tlog::none();
  pSVar1 = tlog::Stream::operator<<
                     (&local_28,(char (*) [45])"===========================================\n");
  pSVar1 = tlog::Stream::operator<<
                     (pSVar1,(char (*) [45])"===== tinylogger demo =====================\n");
  tlog::Stream::operator<<(pSVar1,(char (*) [44])"===========================================");
  tlog::Stream::~Stream(&local_28);
  tlog::info();
  pSVar1 = tlog::Stream::operator<<
                     (&local_50,(char (*) [47])"This is an info message meant to let you know ");
  local_54 = 0x2a;
  pSVar1 = tlog::Stream::operator<<(pSVar1,&local_54);
  tlog::Stream::operator<<
            (pSVar1,(char (*) [78])
                    " is the Answer to the Ultimate Question of Life, the Universe, and Everything")
  ;
  tlog::Stream::~Stream(&local_50);
  tlog::debug();
  tlog::Stream::operator<<
            (&local_70,
             (char (*) [76])
             "You can only see this message if this demo has been compiled in debug mode.");
  tlog::Stream::~Stream(&local_70);
  tlog::warning();
  pSVar1 = tlog::Stream::operator<<(&local_88,(char (*) [6])"This ");
  pSVar1 = tlog::Stream::operator<<(pSVar1,(char (*) [4])0x11926a);
  pSVar1 = tlog::Stream::operator<<(pSVar1,(char (*) [3])"a ");
  tlog::Stream::operator<<(pSVar1,(char (*) [9])"warning!");
  tlog::Stream::~Stream(&local_88);
  tlog::error();
  pSVar1 = tlog::Stream::operator<<
                     (&local_a0,
                      (char (*) [88])
                      "This is an error message that is so long, it likely does not fit within a single line. "
                     );
  pSVar1 = tlog::Stream::operator<<
                     (pSVar1,(char (*) [90])
                             "The purpose of this message is to make sure line breaks do not break anything (get it?). "
                     );
  tlog::Stream::operator<<
            (pSVar1,(char (*) [60])"This sentence only exists to make this message even longer.");
  tlog::Stream::~Stream(&local_a0);
  tlog::info();
  tlog::Stream::operator<<
            ((Stream *)&progress.mCurrent,(char (*) [32])"Demonstrating a progress bar...");
  tlog::Stream::~Stream((Stream *)&progress.mCurrent);
  tlog::progress((Progress *)auStack_d8,100);
  for (local_dc = 1; local_dc < 0x65; local_dc = local_dc + 1) {
    local_ec = 10;
    std::chrono::duration<long,std::ratio<1l,1000l>>::duration<int,void>
              ((duration<long,std::ratio<1l,1000l>> *)&local_e8,&local_ec);
    std::this_thread::sleep_for<long,std::ratio<1l,1000l>>(&local_e8);
    tlog::Progress::update((Progress *)auStack_d8,(long)local_dc);
  }
  tlog::success();
  pSVar1 = tlog::Stream::operator<<(&local_108,(char (*) [25])"Progress finished after ");
  scopedLogger._120_8_ = tlog::Progress::duration((Progress *)auStack_d8);
  tlog::durationToString<std::chrono::duration<long,std::ratio<1l,1000000l>>>
            (local_128,(duration<long,_std::ratio<1L,_1000000L>_>)scopedLogger._120_8_);
  tlog::Stream::operator<<
            (pSVar1,(basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_128);
  std::__cxx11::string::~string((string *)local_128);
  tlog::Stream::~Stream(&local_108);
  std::allocator<char>::allocator();
  std::__cxx11::string::string(local_1d0,"inner scope",&local_1d1);
  local_230 = &local_228;
  __r = tlog::ConsoleOutput::global();
  std::shared_ptr<tlog::IOutput>::shared_ptr<tlog::ConsoleOutput,void>(&local_228,__r);
  local_218.super___shared_ptr<tlog::IOutput,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi =
       (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x1;
  local_218.super___shared_ptr<tlog::IOutput,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
       (element_type *)&local_228;
  std::allocator<std::shared_ptr<tlog::IOutput>_>::allocator(&local_232);
  __l._M_len = (size_type)
               local_218.super___shared_ptr<tlog::IOutput,_(__gnu_cxx::_Lock_policy)2>._M_refcount.
               _M_pi;
  __l._M_array = (iterator)
                 local_218.super___shared_ptr<tlog::IOutput,_(__gnu_cxx::_Lock_policy)2>._M_ptr;
  std::
  set<std::shared_ptr<tlog::IOutput>,_std::less<std::shared_ptr<tlog::IOutput>_>,_std::allocator<std::shared_ptr<tlog::IOutput>_>_>
  ::set(&local_208,__l,&local_231,&local_232);
  tlog::Logger::Logger((Logger *)local_1b0,(string *)local_1d0,&local_208);
  std::
  set<std::shared_ptr<tlog::IOutput>,_std::less<std::shared_ptr<tlog::IOutput>_>,_std::allocator<std::shared_ptr<tlog::IOutput>_>_>
  ::~set(&local_208);
  std::allocator<std::shared_ptr<tlog::IOutput>_>::~allocator(&local_232);
  local_390 = &local_218;
  do {
    local_390 = local_390 + -1;
    std::shared_ptr<tlog::IOutput>::~shared_ptr(local_390);
  } while (local_390 != &local_228);
  std::__cxx11::string::~string(local_1d0);
  std::allocator<char>::~allocator((allocator<char> *)&local_1d1);
  std::allocator<char>::allocator();
  std::__cxx11::string::string
            (local_258,"This info message is written by a scoped logger.",&local_259);
  tlog::Logger::info((Logger *)local_1b0,(string *)local_258);
  std::__cxx11::string::~string(local_258);
  std::allocator<char>::~allocator((allocator<char> *)&local_259);
  tlog::Logger::progress((Progress *)auStack_280,(Logger *)local_1b0,100);
  _auStack_d8 = _auStack_280;
  progress.mLogger = (Logger *)local_278.__d.__r;
  progress.mStartTime.__d.__r = (duration)(duration)local_270.__r;
  progress.mTotal = local_268;
  for (local_284 = 1; local_284 < 0x65; local_284 = local_284 + 1) {
    local_294 = 10;
    std::chrono::duration<long,std::ratio<1l,1000l>>::duration<int,void>
              ((duration<long,std::ratio<1l,1000l>> *)&local_290,&local_294);
    std::this_thread::sleep_for<long,std::ratio<1l,1000l>>(&local_290);
    tlog::Progress::update((Progress *)auStack_d8,(long)local_284);
  }
  std::allocator<char>::allocator();
  std::__cxx11::string::string(local_2b8,"Now you know how to use scoped loggers!",&local_2b9);
  tlog::Logger::success((Logger *)local_1b0,(string *)local_2b8);
  std::__cxx11::string::~string(local_2b8);
  std::allocator<char>::~allocator((allocator<char> *)&local_2b9);
  tlog::success();
  tlog::Stream::operator<<
            (&local_2d8,(char (*) [54])"The demo application terminated successfully. Hooray!");
  tlog::Stream::~Stream(&local_2d8);
  tlog::Logger::~Logger((Logger *)local_1b0);
  return local_c;
}

Assistant:

int main() {
    tlog::none()
        << "===========================================\n"
        << "===== tinylogger demo =====================\n"
        << "===========================================";

    tlog::info()
        << "This is an info message meant to let you know "
        << 42 <<
        " is the Answer to the Ultimate Question of Life, the Universe, and Everything";

    tlog::debug() << "You can only see this message if this demo has been compiled in debug mode.";

    tlog::warning() << "This " << "is " << "a " << "warning!";

    tlog::error()
        << "This is an error message that is so long, it likely does not fit within a single line. "
        << "The purpose of this message is to make sure line breaks do not break anything (get it?). "
        << "This sentence only exists to make this message even longer.";

    tlog::info() << "Demonstrating a progress bar...";

    static const int N = 100;

    auto progress = tlog::progress(N);
    for (int i = 1; i <= N; ++i) {
        std::this_thread::sleep_for(std::chrono::milliseconds{10});
        progress.update(i);
    }

    tlog::success() << "Progress finished after " << tlog::durationToString(progress.duration());

    auto scopedLogger = tlog::Logger("inner scope");
    scopedLogger.info("This info message is written by a scoped logger.");
    progress = scopedLogger.progress(N);
    for (int i = 1; i <= N; ++i) {
        std::this_thread::sleep_for(std::chrono::milliseconds{10});
        progress.update(i);
    }
    scopedLogger.success("Now you know how to use scoped loggers!");

    tlog::success() << "The demo application terminated successfully. Hooray!";
}